

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O3

UnicodeString * __thiscall
icu_63::UnicodeString::findAndReplace
          (UnicodeString *this,UnicodeString *oldText,UnicodeString *newText)

{
  short sVar1;
  UnicodeString *pUVar2;
  int32_t length;
  int32_t oldLength;
  int32_t newLength;
  
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    length = (this->fUnion).fFields.fLength;
  }
  else {
    length = (int)sVar1 >> 5;
  }
  sVar1 = (oldText->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    oldLength = (oldText->fUnion).fFields.fLength;
  }
  else {
    oldLength = (int)sVar1 >> 5;
  }
  sVar1 = (newText->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    newLength = (newText->fUnion).fFields.fLength;
  }
  else {
    newLength = (int)sVar1 >> 5;
  }
  pUVar2 = findAndReplace(this,0,length,oldText,0,oldLength,newText,0,newLength);
  return pUVar2;
}

Assistant:

inline UnicodeString&
UnicodeString::findAndReplace(const UnicodeString& oldText,
                  const UnicodeString& newText)
{ return findAndReplace(0, length(), oldText, 0, oldText.length(),
            newText, 0, newText.length()); }